

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O1

void HalfMergeUVPlane(uint8_t *src_u,int src_stride_u,uint8_t *src_v,int src_stride_v,
                     uint8_t *dst_uv,int dst_stride_uv,int width,int height)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  undefined4 in_register_00000034;
  ulong uVar4;
  code *UNRECOVERED_JUMPTABLE;
  int iVar5;
  
  uVar4 = CONCAT44(in_register_00000034,src_stride_u);
  uVar1 = height;
  if (height < 0) {
    uVar1 = -height;
    src_u = src_u + ~height * src_stride_u;
    src_v = src_v + ~height * src_stride_v;
    uVar4 = (ulong)(uint)-src_stride_u;
    src_stride_v = -src_stride_v;
  }
  uVar2 = cpu_info_;
  if (cpu_info_ == 0) {
    uVar2 = InitCpuFlags();
  }
  pcVar3 = HalfMergeUVRow_C;
  if ((uVar2 & 0x40) != 0) {
    pcVar3 = HalfMergeUVRow_SSSE3;
  }
  UNRECOVERED_JUMPTABLE = HalfMergeUVRow_C;
  if ((width & 0xfU) == 0) {
    UNRECOVERED_JUMPTABLE = pcVar3;
  }
  uVar2 = cpu_info_;
  if (cpu_info_ == 0) {
    uVar2 = InitCpuFlags();
  }
  pcVar3 = UNRECOVERED_JUMPTABLE;
  if ((uVar2 & 0x400) != 0) {
    pcVar3 = HalfMergeUVRow_AVX2;
  }
  if ((width & 0x1fU) == 0) {
    UNRECOVERED_JUMPTABLE = pcVar3;
  }
  if (1 < (int)uVar1) {
    iVar5 = 0;
    do {
      (*UNRECOVERED_JUMPTABLE)(src_u,uVar4,src_v,src_stride_v,dst_uv,width);
      src_u = src_u + (int)uVar4 * 2;
      src_v = src_v + src_stride_v * 2;
      dst_uv = dst_uv + dst_stride_uv;
      iVar5 = iVar5 + 2;
    } while (iVar5 < (int)(uVar1 - 1));
  }
  if ((uVar1 & 1) == 0) {
    return;
  }
  (*UNRECOVERED_JUMPTABLE)(src_u,0,src_v,0,dst_uv);
  return;
}

Assistant:

LIBYUV_API
void HalfMergeUVPlane(const uint8_t* src_u,
                      int src_stride_u,
                      const uint8_t* src_v,
                      int src_stride_v,
                      uint8_t* dst_uv,
                      int dst_stride_uv,
                      int width,
                      int height) {
  int y;
  void (*HalfMergeUVRow)(const uint8_t* src_u, int src_stride_u,
                         const uint8_t* src_v, int src_stride_v,
                         uint8_t* dst_uv, int width) = HalfMergeUVRow_C;

  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_u = src_u + (height - 1) * src_stride_u;
    src_v = src_v + (height - 1) * src_stride_v;
    src_stride_u = -src_stride_u;
    src_stride_v = -src_stride_v;
  }
#if defined(HAS_HALFMERGEUVROW_NEON)
  if (TestCpuFlag(kCpuHasNEON) && IS_ALIGNED(width, 16)) {
    HalfMergeUVRow = HalfMergeUVRow_NEON;
  }
#endif
#if defined(HAS_HALFMERGEUVROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3) && IS_ALIGNED(width, 16)) {
    HalfMergeUVRow = HalfMergeUVRow_SSSE3;
  }
#endif
#if defined(HAS_HALFMERGEUVROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2) && IS_ALIGNED(width, 32)) {
    HalfMergeUVRow = HalfMergeUVRow_AVX2;
  }
#endif
  for (y = 0; y < height - 1; y += 2) {
    // Merge a row of U and V into a row of UV.
    HalfMergeUVRow(src_u, src_stride_u, src_v, src_stride_v, dst_uv, width);
    src_u += src_stride_u * 2;
    src_v += src_stride_v * 2;
    dst_uv += dst_stride_uv;
  }
  if (height & 1) {
    HalfMergeUVRow(src_u, 0, src_v, 0, dst_uv, width);
  }
}